

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

int32_t ucnv_fromUChars_63(UConverter *cnv,char *dest,int32_t destCapacity,UChar *src,
                          int32_t srcLength,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  int iVar2;
  UChar *sourceLimit;
  char *dest_00;
  char *dest_local;
  UChar *src_local;
  char *local_440;
  char buffer [1024];
  char local_38 [8];
  
  iVar1 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0 || cnv == (UConverter *)0x0) ||
       ((srcLength < -1 || dest == (char *)0x0 && 0 < destCapacity ||
        (src == (UChar *)0x0 && srcLength != 0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar1 = 0;
    }
    else {
      dest_local = dest;
      src_local = src;
      _reset(cnv,UCNV_RESET_FROM_UNICODE,'\x01');
      dest_00 = dest_local;
      if (srcLength == -1) {
        srcLength = u_strlen_63(src_local);
      }
      if (srcLength < 1) {
        iVar2 = 0;
      }
      else {
        sourceLimit = src_local + (uint)srcLength;
        local_440 = dest_00;
        if (0 < destCapacity) {
          iVar2 = -1;
          if (dest_local < (char *)0xffffffff80000001) {
            iVar2 = (int)dest_local + 0x7fffffff;
          }
          iVar2 = iVar2 - (int)dest_local;
          if (iVar2 < destCapacity) {
            destCapacity = iVar2;
          }
        }
        ucnv_fromUnicode_63(cnv,&dest_local,dest_local + destCapacity,&src_local,sourceLimit,
                            (int32_t *)0x0,'\x01',pErrorCode);
        iVar2 = (int)dest_local - (int)local_440;
        dest_00 = local_440;
        if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
          do {
            *pErrorCode = U_ZERO_ERROR;
            dest_local = buffer;
            ucnv_fromUnicode_63(cnv,&dest_local,local_38,&src_local,sourceLimit,(int32_t *)0x0,
                                '\x01',pErrorCode);
            iVar2 = iVar2 + ((int)dest_local - (int)buffer);
            dest_00 = local_440;
          } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
        }
      }
      iVar1 = u_terminateChars_63(dest_00,destCapacity,iVar2,pErrorCode);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_fromUChars(UConverter *cnv,
                char *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    char *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetFromUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR) {
            char buffer[1024];

            destLimit=buffer+sizeof(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            } while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateChars(originalDest, destCapacity, destLength, pErrorCode);
}